

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSparseSDF.h
# Opt level: O1

uint HsiehHash<6>(void *pdata)

{
  long lVar1;
  uint uVar2;
  unsigned_short *data;
  
  uVar2 = 0x18;
  lVar1 = 0;
  do {
    uVar2 = *(ushort *)((long)pdata + lVar1 * 4) + uVar2;
    uVar2 = uVar2 * 0x10000 ^ (uint)*(ushort *)((long)pdata + lVar1 * 4 + 2) << 0xb ^ uVar2;
    uVar2 = (uVar2 >> 0xb) + uVar2;
    lVar1 = lVar1 + 1;
  } while ((int)lVar1 != 6);
  uVar2 = uVar2 * 8 ^ uVar2;
  uVar2 = (uVar2 >> 5) + uVar2;
  uVar2 = uVar2 * 0x10 ^ uVar2;
  uVar2 = (uVar2 >> 0x11) + uVar2;
  uVar2 = uVar2 * 0x2000000 ^ uVar2;
  return (uVar2 >> 6) + uVar2;
}

Assistant:

unsigned int HsiehHash(const void* pdata)
{
	const unsigned short*	data=(const unsigned short*)pdata;
	unsigned				hash=DWORDLEN<<2,tmp;
	for(int i=0;i<DWORDLEN;++i)
	{
		hash	+=	data[0];
		tmp		=	(data[1]<<11)^hash;
		hash	=	(hash<<16)^tmp;
		data	+=	2;
		hash	+=	hash>>11;
	}
	hash^=hash<<3;hash+=hash>>5;
	hash^=hash<<4;hash+=hash>>17;
	hash^=hash<<25;hash+=hash>>6;
	return(hash);
}